

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_earthbind(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  int in_EDI;
  CHAR_DATA *victim;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa4;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  
  bVar1 = is_affected(in_RCX,in_EDI);
  if ((!bVar1) &&
     (bVar1 = is_affected_by(in_stack_ffffffffffffff78,(int)((ulong)in_RCX >> 0x20)), bVar1)) {
    bVar1 = saves_spell(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa4);
    if (!bVar1) {
      init_affect((AFFECT_DATA *)0x620737);
      affect_to_char(in_RCX,in_stack_ffffffffffffff68);
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RCX,in_stack_ffffffffffffff68,0);
      return;
    }
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    return;
  }
  send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

void spell_earthbind(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (is_affected(victim, sn) || !is_affected_by(victim, AFF_FLYING))
	{
		send_to_char("Their feet are already on the ground.\n\r", ch);
		return;
	}

	if (saves_spell(level, victim, DAM_OTHER))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_earthbind;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 5;
	af.location = 0;
	af.mod_name = MOD_LEVITATION;
	affect_to_char(victim, &af);

	send_to_char("Your feet suddenly become heavy and earthbound.\n\r", victim);
	act("$n suddenly drops to the ground.", victim, 0, 0, TO_ROOM);
}